

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

SplitLayerParams * __thiscall
CoreML::Specification::SplitLayerParams::New(SplitLayerParams *this,Arena *arena)

{
  SplitLayerParams *this_00;
  
  this_00 = (SplitLayerParams *)operator_new(0x20);
  SplitLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SplitLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SplitLayerParams* SplitLayerParams::New(::google::protobuf::Arena* arena) const {
  SplitLayerParams* n = new SplitLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}